

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

uint32_t __thiscall VmaAllocator_T::CalculateGlobalMemoryTypeBits(VmaAllocator_T *this)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0xffffffff;
  if ((this->m_UseAmdDeviceCoherentMemory == false) &&
     (uVar4 = (ulong)(this->m_MemProps).memoryTypeCount, uVar4 != 0)) {
    uVar3 = 0;
    do {
      bVar1 = (byte)uVar3 & 0x1f;
      uVar2 = uVar2 & (-(uint)(((this->m_MemProps).memoryTypes[uVar3].propertyFlags & 0x40) == 0) |
                      -2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  return uVar2;
}

Assistant:

uint32_t VmaAllocator_T::CalculateGlobalMemoryTypeBits() const
{
    // Make sure memory information is already fetched.
    VMA_ASSERT(GetMemoryTypeCount() > 0);

    uint32_t memoryTypeBits = UINT32_MAX;

    if(!m_UseAmdDeviceCoherentMemory)
    {
        // Exclude memory types that have VK_MEMORY_PROPERTY_DEVICE_COHERENT_BIT_AMD.
        for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
        {
            if((m_MemProps.memoryTypes[memTypeIndex].propertyFlags & VK_MEMORY_PROPERTY_DEVICE_COHERENT_BIT_AMD_COPY) != 0)
            {
                memoryTypeBits &= ~(1u << memTypeIndex);
            }
        }
    }

    return memoryTypeBits;
}